

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void bloaty::ReadDWARFInlines(File *file,RangeSink *sink,bool include_line)

{
  long *plVar1;
  uint16_t uVar2;
  pointer pAVar3;
  pointer pcVar4;
  uint64_t uVar5;
  uint32_t __val;
  char cVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  Abbrev *pAVar10;
  string *psVar11;
  undefined8 *puVar12;
  uint32_t uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  pointer pAVar15;
  uint64_t vmaddr;
  char *pcVar16;
  _Storage<unsigned_long,_true> unaff_R12;
  ulong uVar17;
  uint64_t uVar18;
  optional<unsigned_long> oVar19;
  string last_source;
  DIEReader die_reader;
  LineInfoReader line_info_reader;
  CUIter iter;
  InfoReader reader;
  CU cu;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_2e8;
  char *local_2d8 [3];
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_2c0;
  char *local_2b0 [2];
  long *local_2a0;
  size_t local_298;
  long local_290;
  undefined8 uStack_288;
  uint local_27c;
  string local_278;
  Abbrev *local_258;
  RangeSink *local_250;
  DIEReader local_248;
  LineInfoReader local_230;
  CUIter local_180;
  InfoReader local_168;
  CU local_e8;
  
  local_250 = sink;
  if (((file->debug_info)._M_len == 0) || ((file->debug_line)._M_len == 0)) {
    Throw("no debug info",0x2d1);
  }
  uVar17 = CONCAT71(in_register_00000011,include_line) & 0xffffffff;
  local_168.skeleton_ = (CU *)0x0;
  local_168.stmt_list_map_._M_h._M_buckets = &local_168.stmt_list_map_._M_h._M_single_bucket;
  local_168.stmt_list_map_._M_h._M_bucket_count = 1;
  local_168.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_168.stmt_list_map_._M_h._M_element_count = 0;
  local_168.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_168.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_168.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_168.abbrev_tables_._M_h._M_buckets = &local_168.abbrev_tables_._M_h._M_single_bucket;
  local_168.abbrev_tables_._M_h._M_bucket_count = 1;
  local_168.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_168.abbrev_tables_._M_h._M_element_count = 0;
  local_168.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_168.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
  local_168.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_168.dwarf_ = file;
  dwarf::InfoReader::GetCUIter(&local_180,&local_168,kDebugInfo,0);
  local_e8.unit_name_._M_dataplus._M_p = (pointer)&local_e8.unit_name_.field_2;
  local_e8.data_._M_len = 0;
  local_e8.data_._M_str = (char *)0x0;
  local_e8.entire_unit_._M_len = 0;
  local_e8.entire_unit_._M_str = (char *)0x0;
  local_e8.unit_name_._M_string_length = 0;
  local_e8.unit_name_.field_2._M_local_buf[0] = '\0';
  local_e8.addr_base_ = 0;
  local_e8.str_offsets_base_ = 0;
  local_e8.range_lists_base_ = 0;
  local_e8.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
  local_e8.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8.strp_callback_._M_invoker = (_Invoker_type)0x0;
  local_248.remaining_._M_len = 0;
  local_248.remaining_._M_str = (char *)0x0;
  local_248.depth_ = 0;
  local_230.info_.address = 0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.remaining_._M_len = 0;
  local_230.remaining_._M_str = (char *)0x0;
  local_230.info_.file = 1;
  local_230.info_.line = 1;
  local_230.info_._16_7_ = 0;
  local_230.info_.discriminator._3_1_ = 0;
  local_230.info_.end_sequence = false;
  local_230.info_.basic_block = false;
  local_230.info_.prologue_end = false;
  local_230.info_.epilogue_begin = false;
  local_230.info_.is_stmt = false;
  local_230.info_.op_index = '\0';
  local_230.info_.isa = '\0';
  local_230.file_ = file;
  bVar7 = dwarf::CUIter::NextCU(&local_180,&local_168,&local_e8);
  if (!bVar7) {
    Throw("debug info is present, but empty",0x2db);
  }
  local_27c = (uint)CONCAT71(in_register_00000011,include_line);
  do {
    pAVar10 = dwarf::DIEReader::ReadCode(&local_248,&local_e8);
    if (pAVar10 != (Abbrev *)0x0) {
      pAVar15 = (pAVar10->attr).
                super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar3 = (pAVar10->attr).
               super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = 0;
      local_258 = pAVar10;
      if (pAVar15 != pAVar3) {
        do {
          uVar2 = pAVar15->name;
          dwarf::AttrValue::ParseAttr
                    ((AttrValue *)&local_2c0.string_,&local_e8,pAVar15->form,&local_248.remaining_);
          local_2d8[0] = local_2b0[0];
          local_2e8.string_._M_str = (char *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_);
          local_2e8.uint_ = local_2c0.uint_;
          if (uVar2 == 0x10) {
            oVar19 = dwarf::AttrValue::ToUint((AttrValue *)&local_2e8.string_,&local_e8);
            unaff_R12._M_value =
                 oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            uVar14 = oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._8_4_;
          }
          pAVar15 = pAVar15 + 1;
        } while (pAVar15 != pAVar3);
        uVar17 = (ulong)local_27c;
      }
      pAVar10 = local_258;
      if ((uVar14 & 1) != 0) {
        dwarf::LineInfoReader::SeekToOffset
                  (&local_230,unaff_R12._M_value,local_e8.unit_sizes_.addr8_ * '\x04' + '\x04');
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        local_278._M_string_length = 0;
        local_278.field_2._M_local_buf[0] = '\0';
        vmaddr = 0;
        while (bVar7 = dwarf::LineInfoReader::ReadLineInfo(&local_230),
              uVar5 = local_230.info_.address, bVar7) {
          if (local_230.info_.end_sequence == true) {
            psVar11 = &local_278;
LAB_001b6a36:
            pcVar4 = (psVar11->_M_dataplus)._M_p;
            local_2a0 = &local_290;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a0,pcVar4,pcVar4 + psVar11->_M_string_length);
          }
          else {
            __val = local_230.info_.line;
            psVar11 = dwarf::LineInfoReader::GetExpandedFilename_abi_cxx11_
                                (&local_230,local_230.info_._8_8_ & 0xffffffff);
            if ((char)uVar17 == '\0') goto LAB_001b6a36;
            local_2e8.uint_ = (uint64_t)local_2d8;
            pcVar4 = (psVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e8,pcVar4,pcVar4 + psVar11->_M_string_length);
            std::__cxx11::string::append((char *)&local_2e8.uint_);
            cVar8 = '\x01';
            if (9 < __val) {
              uVar13 = __val;
              cVar6 = '\x04';
              do {
                cVar8 = cVar6;
                if (uVar13 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_001b6af1;
                }
                if (uVar13 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_001b6af1;
                }
                if (uVar13 < 10000) goto LAB_001b6af1;
                bVar7 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar6 = cVar8 + '\x04';
              } while (bVar7);
              cVar8 = cVar8 + '\x01';
            }
LAB_001b6af1:
            local_2c0.uint_ = (uint64_t)local_2b0;
            std::__cxx11::string::_M_construct((ulong)&local_2c0,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_2c0.uint_,local_2c0._8_4_,__val);
            pcVar16 = (char *)0xf;
            if ((char **)local_2e8.uint_ != local_2d8) {
              pcVar16 = local_2d8[0];
            }
            if (pcVar16 < local_2e8.string_._M_str + CONCAT44(local_2c0._12_4_,local_2c0._8_4_)) {
              pcVar16 = (char *)0xf;
              if ((char **)local_2c0.uint_ != local_2b0) {
                pcVar16 = local_2b0[0];
              }
              if (pcVar16 < local_2e8.string_._M_str + CONCAT44(local_2c0._12_4_,local_2c0._8_4_))
              goto LAB_001b6b5f;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_2c0,0,(char *)0x0,local_2e8.uint_);
            }
            else {
LAB_001b6b5f:
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_2e8.uint_,local_2c0.uint_);
            }
            plVar1 = puVar12 + 2;
            if ((long *)*puVar12 == plVar1) {
              local_290 = *plVar1;
              uStack_288 = puVar12[3];
              local_2a0 = &local_290;
            }
            else {
              local_290 = *plVar1;
              local_2a0 = (long *)*puVar12;
            }
            local_298 = puVar12[1];
            *puVar12 = plVar1;
            puVar12[1] = 0;
            *(undefined1 *)plVar1 = 0;
            if ((char **)local_2c0.uint_ != local_2b0) {
              operator_delete((void *)local_2c0.uint_,(ulong)(local_2b0[0] + 1));
            }
            if ((char **)local_2e8.uint_ != local_2d8) {
              operator_delete((void *)local_2e8.uint_,(ulong)(local_2d8[0] + 1));
            }
          }
          uVar18 = uVar5;
          if ((vmaddr != 0) &&
             (((local_230.info_.end_sequence != false ||
               ((uVar18 = vmaddr, local_278._M_string_length != 0 &&
                ((local_298 != local_278._M_string_length ||
                 ((local_298 != 0 &&
                  (iVar9 = bcmp(local_2a0,local_278._M_dataplus._M_p,local_298), iVar9 != 0))))))))
              && (RangeSink::AddVMRange(local_250,"dwarf_stmtlist",vmaddr,uVar5 - vmaddr,&local_278)
                 , uVar18 = uVar5, local_230.info_.end_sequence != false)))) {
            uVar18 = 0;
          }
          std::__cxx11::string::_M_assign((string *)&local_278);
          vmaddr = uVar18;
          if (local_2a0 != &local_290) {
            operator_delete(local_2a0,local_290 + 1);
          }
        }
        pAVar10 = local_258;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
          pAVar10 = local_258;
        }
      }
    }
    if (pAVar10 == (Abbrev *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_230.expanded_filenames_);
      if (local_230.standard_opcode_lengths_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.standard_opcode_lengths_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_230.standard_opcode_lengths_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_230.standard_opcode_lengths_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_230.filenames_.
          super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.filenames_.
                        super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_230.filenames_.
                              super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_230.filenames_.
                              super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_230.include_directories_.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.include_directories_.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_230.include_directories_.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_230.include_directories_.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.strp_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.strp_callback_.super__Function_base._M_manager)
                  ((_Any_data *)&local_e8.strp_callback_,(_Any_data *)&local_e8.strp_callback_,
                   __destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.unit_name_._M_dataplus._M_p != &local_e8.unit_name_.field_2) {
        operator_delete(local_e8.unit_name_._M_dataplus._M_p,
                        CONCAT71(local_e8.unit_name_.field_2._M_allocated_capacity._1_7_,
                                 local_e8.unit_name_.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_168.abbrev_tables_._M_h);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_168.stmt_list_map_._M_h);
      return;
    }
  } while( true );
}

Assistant:

void ReadDWARFInlines(const dwarf::File& file, RangeSink* sink,
                      bool include_line) {
  if (!file.debug_info.size() || !file.debug_line.size()) {
    THROW("no debug info");
  }

  dwarf::InfoReader reader(file);
  dwarf::CUIter iter = reader.GetCUIter(dwarf::InfoReader::Section::kDebugInfo);
  dwarf::CU cu;
  dwarf::DIEReader die_reader = cu.GetDIEReader();
  dwarf::LineInfoReader line_info_reader(file);

  if (!iter.NextCU(reader, &cu)) {
    THROW("debug info is present, but empty");
  }

  while (auto abbrev = die_reader.ReadCode(cu)) {
    absl::optional<uint64_t> stmt_list;
    die_reader.ReadAttributes(
        cu, abbrev, [&stmt_list, &cu](uint16_t tag, dwarf::AttrValue val) {
          if (tag == DW_AT_stmt_list) {
            stmt_list = val.ToUint(cu);
          }
        });

    if (stmt_list) {
      line_info_reader.SeekToOffset(*stmt_list, cu.unit_sizes().address_size());
      ReadDWARFStmtList(include_line, &line_info_reader, sink);
    }
  }
}